

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

void decSetCoeff(decNumber *dn,decContext *set,uint8_t *lsu,int32_t len,int32_t *residue,
                uint32_t *status)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t uVar9;
  uint uVar10;
  int32_t iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  
  uVar2 = set->digits;
  uVar16 = len - uVar2;
  if (uVar16 == 0 || len < (int)uVar2) {
    if (dn->lsu != lsu) {
      lVar4 = 0;
      for (iVar11 = len; 0 < iVar11; iVar11 = iVar11 + -1) {
        dn->lsu[lVar4] = lsu[lVar4];
        lVar4 = lVar4 + 1;
      }
      dn->digits = len;
    }
    if (*residue == 0) {
      return;
    }
    *status = *status | 0x820;
    return;
  }
  dn->exponent = dn->exponent + uVar16;
  *(byte *)((long)status + 1) = *(byte *)((long)status + 1) | 8;
  iVar6 = *residue;
  if (iVar6 < 2) {
    if ((int)uVar2 < 0) {
      if (iVar6 != 1) {
        for (; 0 < len; len = len + -1) {
          if (*lsu != '\0') {
            *residue = 1;
            goto LAB_00242c95;
          }
          lsu = lsu + 1;
        }
        if (iVar6 == 0) goto LAB_00242c99;
      }
      goto LAB_00242c95;
    }
  }
  else {
    *residue = 1;
    if ((int)uVar2 < 0) {
LAB_00242c95:
      *(byte *)status = (byte)*status | 0x20;
LAB_00242c99:
      dn->lsu[0] = '\0';
      dn->digits = 1;
      return;
    }
    iVar6 = 1;
  }
  uVar12 = ~uVar2 + len;
  uVar14 = (ulong)uVar12;
  for (lVar4 = 0; iVar5 = (int)lVar4, iVar5 + 1 < (int)uVar16; lVar4 = lVar4 + 1) {
    if (lsu[lVar4] != '\0') {
      *residue = 1;
      iVar6 = 1;
    }
    uVar14 = uVar14 - 1;
  }
  bVar1 = lsu[lVar4];
  uVar10 = (uint)bVar1;
  if (iVar5 + (uVar2 - len) == -1) {
    if (bVar1 < 5) {
      if (uVar10 != 0) {
        iVar5 = 3;
        goto LAB_00242c48;
      }
    }
    else {
      iVar5 = 7;
      if (uVar10 == 5) {
        iVar5 = iVar6 + 5;
      }
LAB_00242c48:
      *residue = iVar5;
    }
    iVar6 = set->digits;
    if (0 < iVar6) {
      dn->digits = iVar6;
      lVar17 = 0;
      for (; 0 < iVar6; iVar6 = iVar6 + -1) {
        dn->lsu[lVar17] = lsu[lVar4 + 1 + lVar17];
        lVar17 = lVar17 + 1;
      }
      goto LAB_00242c78;
    }
  }
  else {
    uVar7 = (ulong)uVar12 - lVar4;
    uVar8 = uVar7 & 0xffffffff;
    uVar15 = (uint)(bVar1 >> ((byte)uVar7 & 0x1f)) * multies[uVar8] >> 0x11;
    iVar13 = 1;
    if (DECPOWERS[uVar8] * uVar15 == uVar10) {
      iVar13 = iVar6;
    }
    uVar10 = uVar15 * 0x199a >> 0x10;
    *residue = (uint)""[uVar10 * -10 + uVar15] + iVar13;
    iVar6 = set->digits;
    if (0 < iVar6) {
      uVar7 = (ulong)uVar16 - lVar4;
      dn->digits = iVar6;
      iVar13 = (uVar12 + iVar6) - iVar5;
      lVar17 = 0;
      do {
        uVar9 = (uint8_t)uVar10;
        dn->lsu[lVar17] = uVar9;
        if (iVar13 < 1) break;
        uVar10 = (uint)(lsu[lVar4 + 1 + lVar17] >> ((byte)uVar7 & 0x1f)) *
                 multies[uVar7 & 0xffffffff] >> 0x11;
        dn->lsu[lVar17] =
             (lsu[lVar4 + 1 + lVar17] - (char)DECPOWERS[uVar7 & 0xffffffff] * (char)uVar10) *
             (char)DECPOWERS[(uVar2 - len) + iVar5 + 1] + uVar9;
        iVar3 = (int)lVar17;
        iVar13 = iVar13 + -1;
        lVar17 = lVar17 + 1;
      } while (0 < (((int)uVar14 + iVar6) - iVar3) - (int)uVar7);
      goto LAB_00242c78;
    }
  }
  dn->lsu[0] = '\0';
  dn->digits = 1;
LAB_00242c78:
  if (*residue != 0) {
    *(byte *)status = (byte)*status | 0x20;
  }
  return;
}

Assistant:

static void decSetCoeff(decNumber *dn, decContext *set, const Unit *lsu,
                        Int len, Int *residue, uInt *status) {
  Int   discard;              /* number of digits to discard  */
  uInt  cut;                  /* cut point in Unit  */
  const Unit *up;             /* work  */
  Unit  *target;              /* ..  */
  Int   count;                /* ..  */
  #if DECDPUN<=4
  uInt  temp;                 /* ..  */
  #endif

  discard=len-set->digits;    /* digits to discard  */
  if (discard<=0) {           /* no digits are being discarded  */
    if (dn->lsu!=lsu) {       /* copy needed  */
      /* copy the coefficient array to the result number; no shift needed  */
      count=len;              /* avoids D2U  */
      up=lsu;
      for (target=dn->lsu; count>0; target++, up++, count-=DECDPUN)
        *target=*up;
      dn->digits=len;         /* set the new length  */
      }
    /* dn->exponent and residue are unchanged, record any inexactitude  */
    if (*residue!=0) *status|=(DEC_Inexact | DEC_Rounded);
    return;
    }

  /* some digits must be discarded ...  */
  dn->exponent+=discard;      /* maintain numerical value  */
  *status|=DEC_Rounded;       /* accumulate Rounded status  */
  if (*residue>1) *residue=1; /* previous residue now to right, so reduce  */

  if (discard>len) {          /* everything, +1, is being discarded  */
    /* guard digit is 0  */
    /* residue is all the number [NB could be all 0s]  */
    if (*residue<=0) {        /* not already positive  */
      count=len;              /* avoids D2U  */
      for (up=lsu; count>0; up++, count-=DECDPUN) if (*up!=0) { /* found non-0  */
        *residue=1;
        break;                /* no need to check any others  */
        }
      }
    if (*residue!=0) *status|=DEC_Inexact; /* record inexactitude  */
    *dn->lsu=0;               /* coefficient will now be 0  */
    dn->digits=1;             /* ..  */
    return;
    } /* total discard  */

  /* partial discard [most common case]  */
  /* here, at least the first (most significant) discarded digit exists  */

  /* spin up the number, noting residue during the spin, until get to  */
  /* the Unit with the first discarded digit.  When reach it, extract  */
  /* it and remember its position  */
  count=0;
  for (up=lsu;; up++) {
    count+=DECDPUN;
    if (count>=discard) break; /* full ones all checked  */
    if (*up!=0) *residue=1;
    } /* up  */

  /* here up -> Unit with first discarded digit  */
  cut=discard-(count-DECDPUN)-1;
  if (cut==DECDPUN-1) {       /* unit-boundary case (fast)  */
    Unit half=(Unit)powers[DECDPUN]>>1;
    /* set residue directly  */
    if (*up>=half) {
      if (*up>half) *residue=7;
      else *residue+=5;       /* add sticky bit  */
      }
     else { /* <half  */
      if (*up!=0) *residue=3; /* [else is 0, leave as sticky bit]  */
      }
    if (set->digits<=0) {     /* special for Quantize/Subnormal :-(  */
      *dn->lsu=0;             /* .. result is 0  */
      dn->digits=1;           /* ..  */
      }
     else {                   /* shift to least  */
      count=set->digits;      /* now digits to end up with  */
      dn->digits=count;       /* set the new length  */
      up++;                   /* move to next  */
      /* on unit boundary, so shift-down copy loop is simple  */
      for (target=dn->lsu; count>0; target++, up++, count-=DECDPUN)
        *target=*up;
      }
    } /* unit-boundary case  */

   else { /* discard digit is in low digit(s), and not top digit  */
    uInt  discard1;                /* first discarded digit  */
    uInt  quot, rem;               /* for divisions  */
    if (cut==0) quot=*up;          /* is at bottom of unit  */
     else /* cut>0 */ {            /* it's not at bottom of unit  */
      #if DECDPUN<=4
        U_ASSERT(/* cut >= 0 &&*/ cut <= 4);
        quot=QUOT10(*up, cut);
        rem=*up-quot*powers[cut];
      #else
        rem=*up%powers[cut];
        quot=*up/powers[cut];
      #endif
      if (rem!=0) *residue=1;
      }
    /* discard digit is now at bottom of quot  */
    #if DECDPUN<=4
      temp=(quot*6554)>>16;        /* fast /10  */
      /* Vowels algorithm here not a win (9 instructions)  */
      discard1=quot-X10(temp);
      quot=temp;
    #else
      discard1=quot%10;
      quot=quot/10;
    #endif
    /* here, discard1 is the guard digit, and residue is everything  */
    /* else [use mapping array to accumulate residue safely]  */
    *residue+=resmap[discard1];
    cut++;                         /* update cut  */
    /* here: up -> Unit of the array with bottom digit  */
    /*       cut is the division point for each Unit  */
    /*       quot holds the uncut high-order digits for the current unit  */
    if (set->digits<=0) {          /* special for Quantize/Subnormal :-(  */
      *dn->lsu=0;                  /* .. result is 0  */
      dn->digits=1;                /* ..  */
      }
     else {                        /* shift to least needed  */
      count=set->digits;           /* now digits to end up with  */
      dn->digits=count;            /* set the new length  */
      /* shift-copy the coefficient array to the result number  */
      for (target=dn->lsu; ; target++) {
        *target=(Unit)quot;
        count-=(DECDPUN-cut);
        if (count<=0) break;
        up++;
        quot=*up;
        #if DECDPUN<=4
          quot=QUOT10(quot, cut);
          rem=*up-quot*powers[cut];
        #else
          rem=quot%powers[cut];
          quot=quot/powers[cut];
        #endif
        *target=(Unit)(*target+rem*powers[DECDPUN-cut]);
        count-=cut;
        if (count<=0) break;
        } /* shift-copy loop  */
      } /* shift to least  */
    } /* not unit boundary  */

  if (*residue!=0) *status|=DEC_Inexact; /* record inexactitude  */
  return;
  }